

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::DeadBranchElimPass::EraseDeadBlocks
          (DeadBranchElimPass *this,Function *func,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *live_blocks,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *unreachable_merges,
          unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
          *unreachable_continues)

{
  Instruction *pIVar1;
  Instruction *pIVar2;
  IRContext *pIVar3;
  mapped_type pBVar4;
  pointer puVar5;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *pvVar6;
  array<signed_char,_4UL> aVar7;
  _Type acVar8;
  const_iterator cVar9;
  mapped_type *ppBVar10;
  const_iterator cVar11;
  uint32_t index;
  BasicBlock *pBVar12;
  iterator __position;
  bool bVar13;
  Op local_ec;
  Instruction *local_e8;
  Instruction *local_e0;
  IRContext *local_d8;
  int local_d0 [2];
  undefined1 local_c8 [40];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_a0;
  Function *local_98;
  initializer_list<spvtools::opt::Operand> local_90;
  undefined1 local_80 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_60;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *local_58;
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_50;
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_48;
  MemPass *local_40;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *local_38;
  
  __position._M_current =
       (func->blocks_).
       super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (__position._M_current ==
      (func->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar13 = false;
  }
  else {
    local_58 = &func->blocks_;
    bVar13 = false;
    local_98 = func;
    local_50 = &live_blocks->_M_h;
    local_48 = &unreachable_merges->_M_h;
    local_40 = &this->super_MemPass;
    do {
      local_c8._0_8_ =
           ((__position._M_current)->_M_t).
           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      cVar9 = std::
              _Hashtable<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&unreachable_continues->_M_h,(key_type *)local_c8);
      if (cVar9.
          super__Node_iterator_base<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_false>
          ._M_cur == (__node_type *)0x0) {
        local_c8._0_8_ =
             ((__position._M_current)->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        cVar11 = std::
                 _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(local_48,(key_type *)local_c8);
        if (cVar11.super__Node_iterator_base<spvtools::opt::BasicBlock_*,_false>._M_cur ==
            (__node_type *)0x0) {
          local_c8._0_8_ =
               ((__position._M_current)->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
          cVar11 = std::
                   _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(local_50,(key_type *)local_c8);
          if (cVar11.super__Node_iterator_base<spvtools::opt::BasicBlock_*,_false>._M_cur ==
              (__node_type *)0x0) {
            MemPass::KillAllInsts
                      (&this->super_MemPass,
                       ((__position._M_current)->_M_t).
                       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,true)
            ;
            pvVar6 = local_58;
            puVar5 = (local_58->
                     super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            std::
            vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ::_M_erase(local_58,__position);
            __position._M_current =
                 (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  *)((long)__position._M_current +
                    ((long)(pvVar6->
                           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start - (long)puVar5));
            bVar13 = true;
            func = local_98;
            goto LAB_0054ec50;
          }
        }
        else {
          pBVar12 = ((__position._M_current)->_M_t).
                    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
          pIVar1 = *(Instruction **)
                    ((long)&(pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10
                    );
          if ((pIVar1 == (Instruction *)0x0) ||
             ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false))
          goto LAB_0054ecb3;
          pIVar2 = *(Instruction **)
                    ((long)&(pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x18
                    );
          if ((pIVar1 != pIVar2) || (pIVar2->opcode_ != OpUnreachable)) {
            MemPass::KillAllInsts(&this->super_MemPass,pBVar12,false);
            pBVar12 = ((__position._M_current)->_M_t).
                      super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                      .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
            local_80._0_8_ = (this->super_MemPass).super_Pass.context_;
            local_90._M_array = (iterator)CONCAT44(local_90._M_array._4_4_,0xff);
            local_d8 = (IRContext *)((ulong)local_d8 & 0xffffffff00000000);
            local_ec = OpNop;
            local_c8._0_8_ = (BasicBlock *)0x0;
            local_c8._8_8_ = (undefined **)0x0;
            MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
                      ((spvtools *)&local_e8,(IRContext **)local_80,(Op *)&local_90,(int *)&local_d8
                       ,(int *)&local_ec,(initializer_list<spvtools::opt::Operand> *)local_c8);
            pIVar1 = local_e8;
            local_e8 = (Instruction *)0x0;
            utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                      (&(pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>,pIVar1);
            if (local_e8 != (Instruction *)0x0) {
              (**(code **)(*(long *)local_e8 + 8))();
            }
            local_e8 = (Instruction *)0x0;
            pBVar12 = ((__position._M_current)->_M_t).
                      super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                      .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
            pIVar1 = *(Instruction **)
                      ((long)&(pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction> +
                      0x10);
            if ((pIVar1 == (Instruction *)0x0) ||
               ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)
               ) goto LAB_0054ecb3;
            IRContext::AnalyzeUses
                      ((this->super_MemPass).super_Pass.context_,
                       *(Instruction **)
                        ((long)&(pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction> +
                        0x18));
            pBVar4 = ((__position._M_current)->_M_t).
                     super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                     .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
            pIVar1 = *(Instruction **)
                      ((long)&(pBVar4->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                              sentinel_ + 8);
            if ((pIVar1 == (Instruction *)0x0) ||
               ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)
               ) goto LAB_0054ecb3;
            pIVar3 = (this->super_MemPass).super_Pass.context_;
            local_c8._0_8_ =
                 *(Instruction **)
                  ((long)&(pBVar4->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
                  + 0x10);
            if ((pIVar3->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
              ppBVar10 = std::__detail::
                         _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&pIVar3->instr_to_block_,(key_type *)local_c8);
              *ppBVar10 = pBVar4;
            }
            bVar13 = true;
          }
        }
        __position._M_current = __position._M_current + 1;
      }
      else {
        local_c8._0_8_ =
             ((__position._M_current)->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        cVar9 = std::
                _Hashtable<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&unreachable_continues->_M_h,(key_type *)local_c8);
        pIVar1 = *(Instruction **)
                  (*(long *)((long)cVar9.
                                   super__Node_iterator_base<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_false>
                                   ._M_cur + 0x10) + 8);
        aVar7._M_elems[0] = '\0';
        aVar7._M_elems[1] = '\0';
        aVar7._M_elems[2] = '\0';
        aVar7._M_elems[3] = '\0';
        if (pIVar1->has_result_id_ == true) {
          aVar7._M_elems =
               (_Type)Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
        }
        pBVar12 = ((__position._M_current)->_M_t).
                  super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        pIVar1 = *(Instruction **)
                  ((long)&(pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
        if ((pIVar1 == (Instruction *)0x0) ||
           ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false))
        goto LAB_0054ecb3;
        pIVar2 = *(Instruction **)
                  ((long)&(pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x18);
        if ((pIVar1 == pIVar2) && (pIVar2->opcode_ == OpBranch)) {
          index = (pIVar2->has_result_id_ & 1) + 1;
          if (pIVar2->has_type_id_ == false) {
            index = (uint)pIVar2->has_result_id_;
          }
          acVar8 = (_Type)Instruction::GetSingleWordOperand(pIVar2,index);
          if (acVar8 != aVar7._M_elems) {
            pBVar12 = ((__position._M_current)->_M_t).
                      super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                      .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
            goto LAB_0054e8e3;
          }
        }
        else {
LAB_0054e8e3:
          MemPass::KillAllInsts(&this->super_MemPass,pBVar12,false);
          local_c8._0_8_ =
               ((__position._M_current)->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
          cVar9 = std::
                  _Hashtable<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&unreachable_continues->_M_h,(key_type *)local_c8);
          if (cVar9.
              super__Node_iterator_base<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_false>
              ._M_cur == (__node_type *)0x0) {
            __assert_fail("unreachable_continues.count(&*ebi)",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp"
                          ,0x17e,
                          "bool spvtools::opt::DeadBranchElimPass::EraseDeadBlocks(Function *, const std::unordered_set<BasicBlock *> &, const std::unordered_set<BasicBlock *> &, const std::unordered_map<BasicBlock *, BasicBlock *> &)"
                         );
          }
          pBVar12 = ((__position._M_current)->_M_t).
                    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
          local_d8 = (this->super_MemPass).super_Pass.context_;
          local_ec = OpBranch;
          local_d0[1] = 0;
          local_d0[0] = 0;
          local_80._0_8_ = &PTR__SmallVector_00b02ef8;
          local_80._24_8_ = local_80 + 0x10;
          local_60._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_80._8_8_ = 1;
          local_c8._0_4_ = 1;
          local_c8._8_8_ = &PTR__SmallVector_00b02ef8;
          local_c8._16_8_ = 0;
          local_c8._32_8_ = local_c8 + 0x18;
          local_a0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_80._16_4_ = aVar7._M_elems;
          local_38 = __position._M_current;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)(local_c8 + 8),
                     (SmallVector<unsigned_int,_2UL> *)local_80);
          local_90._M_len = 1;
          local_90._M_array = (iterator)local_c8;
          MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
                    ((spvtools *)&local_e0,&local_d8,&local_ec,local_d0 + 1,local_d0,&local_90);
          pIVar1 = local_e0;
          local_e0 = (Instruction *)0x0;
          utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                    (&(pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>,pIVar1);
          if (local_e0 != (Instruction *)0x0) {
            (**(code **)(*(long *)local_e0 + 8))();
          }
          local_e0 = (Instruction *)0x0;
          local_c8._8_8_ = &PTR__SmallVector_00b02ef8;
          if (local_a0 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_a0,local_a0);
          }
          local_a0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_80._0_8_ = &PTR__SmallVector_00b02ef8;
          if (local_60._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_60,local_60._M_head_impl);
          }
          __position._M_current = local_38;
          this = (DeadBranchElimPass *)local_40;
          pIVar3 = (((MemPass *)&local_40->super_Pass)->super_Pass).context_;
          if ((pIVar3->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(pIVar3);
          }
          pBVar12 = ((__position._M_current)->_M_t).
                    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
          pIVar1 = *(Instruction **)
                    ((long)&(pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10
                    );
          if ((pIVar1 == (Instruction *)0x0) ||
             ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false))
          {
LAB_0054ecb3:
            __assert_fail("!insts_.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                          ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
          }
          analysis::DefUseManager::AnalyzeInstUse
                    ((pIVar3->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl,
                     *(Instruction **)
                      ((long)&(pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction> +
                      0x18));
          pBVar4 = ((__position._M_current)->_M_t).
                   super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                   .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
          pIVar1 = *(Instruction **)
                    ((long)&(pBVar4->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                            sentinel_ + 8);
          if ((pIVar1 == (Instruction *)0x0) ||
             ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false))
          goto LAB_0054ecb3;
          pIVar3 = (((MemPass *)&(this->super_MemPass).super_Pass)->super_Pass).context_;
          local_c8._0_8_ =
               *(Instruction **)
                ((long)&(pBVar4->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_ +
                0x10);
          if ((pIVar3->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
            ppBVar10 = std::__detail::
                       _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&pIVar3->instr_to_block_,(key_type *)local_c8);
            *ppBVar10 = pBVar4;
          }
          bVar13 = true;
        }
        __position._M_current = __position._M_current + 1;
        func = local_98;
      }
LAB_0054ec50:
    } while (__position._M_current !=
             (func->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return bVar13;
}

Assistant:

bool DeadBranchElimPass::EraseDeadBlocks(
    Function* func, const std::unordered_set<BasicBlock*>& live_blocks,
    const std::unordered_set<BasicBlock*>& unreachable_merges,
    const std::unordered_map<BasicBlock*, BasicBlock*>& unreachable_continues) {
  bool modified = false;
  for (auto ebi = func->begin(); ebi != func->end();) {
    if (unreachable_continues.count(&*ebi)) {
      uint32_t cont_id = unreachable_continues.find(&*ebi)->second->id();
      if (ebi->begin() != ebi->tail() ||
          ebi->terminator()->opcode() != spv::Op::OpBranch ||
          ebi->terminator()->GetSingleWordInOperand(0u) != cont_id) {
        // Make unreachable, but leave the label.
        KillAllInsts(&*ebi, false);
        // Add unconditional branch to header.
        assert(unreachable_continues.count(&*ebi));
        ebi->AddInstruction(MakeUnique<Instruction>(
            context(), spv::Op::OpBranch, 0, 0,
            std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {cont_id}}}));
        get_def_use_mgr()->AnalyzeInstUse(&*ebi->tail());
        context()->set_instr_block(&*ebi->tail(), &*ebi);
        modified = true;
      }
      ++ebi;
    } else if (unreachable_merges.count(&*ebi)) {
      if (ebi->begin() != ebi->tail() ||
          ebi->terminator()->opcode() != spv::Op::OpUnreachable) {
        // Make unreachable, but leave the label.
        KillAllInsts(&*ebi, false);
        // Add unreachable terminator.
        ebi->AddInstruction(
            MakeUnique<Instruction>(context(), spv::Op::OpUnreachable, 0, 0,
                                    std::initializer_list<Operand>{}));
        context()->AnalyzeUses(ebi->terminator());
        context()->set_instr_block(ebi->terminator(), &*ebi);
        modified = true;
      }
      ++ebi;
    } else if (!live_blocks.count(&*ebi)) {
      // Kill this block.
      KillAllInsts(&*ebi);
      ebi = ebi.Erase();
      modified = true;
    } else {
      ++ebi;
    }
  }

  return modified;
}